

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O2

bool vkt::anon_unknown_0::verifyStencilAttachment
               (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                *reference,ConstPixelBufferAccess *result,PixelBufferAccess *errorImage)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int y;
  int y_00;
  Vec4 *color;
  bool bVar5;
  int x;
  int x_00;
  Maybe<bool> maybeValue;
  Vec4 local_58;
  Vec4 local_48;
  
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  bVar5 = true;
  y_00 = 0;
  do {
    if ((result->m_size).m_data[1] <= y_00) {
      return bVar5;
    }
    for (x_00 = 0; x_00 < (result->m_size).m_data[0]; x_00 = x_00 + 1) {
      iVar3 = tcu::ConstPixelBufferAccess::getPixStencil(result,x_00,y_00,0);
      uVar1 = (reference->
              super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
              )._M_impl.super__Vector_impl_data._M_start[(result->m_size).m_data[0] * y_00 + x_00].
              m_status;
      if ((uVar1 & 4) == 0) {
LAB_00444190:
        color = &local_58;
        bVar2 = bVar5;
      }
      else {
        iVar4 = 0xff;
        if (((byte)uVar1 >> 3 & 1) == 0) {
          iVar4 = 0;
        }
        color = &local_48;
        bVar2 = false;
        if (iVar3 == iVar4) goto LAB_00444190;
      }
      bVar5 = bVar2;
      tcu::PixelBufferAccess::setPixel(errorImage,color,x_00,y_00,0);
    }
    y_00 = y_00 + 1;
  } while( true );
}

Assistant:

bool verifyStencilAttachment (const vector<PixelValue>&		reference,
							  const ConstPixelBufferAccess&	result,
							  const PixelBufferAccess&		errorImage)
{
	const Vec4	red		(1.0f, 0.0f, 0.0f, 1.0f);
	const Vec4	green	(0.0f, 1.0f, 0.0f, 1.0f);
	bool		ok		= true;

	DE_ASSERT(result.getWidth() * result.getHeight() == (int)reference.size());
	DE_ASSERT(result.getWidth() == errorImage.getWidth());
	DE_ASSERT(result.getHeight() == errorImage.getHeight());

	for (int y = 0; y < result.getHeight(); y++)
	for (int x = 0; x < result.getWidth(); x++)
	{
		bool pixelOk = true;

		const deUint32		resultStencil	= result.getPixStencil(x, y);
		const PixelValue&	referenceValue	= reference[x + y * result.getWidth()];
		const Maybe<bool>	maybeValue		= referenceValue.getValue(1);

		if (maybeValue)
		{
			const bool value = *maybeValue;

			if ((value && (resultStencil != 0xFFu))
				|| (!value && resultStencil != 0x0u))
				pixelOk = false;
		}

		if (!pixelOk)
		{
			errorImage.setPixel(red, x, y);
			ok = false;
		}
		else
			errorImage.setPixel(green, x, y);
	}

	return ok;
}